

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O0

QAccessibleInterface * __thiscall QAccessibleTable::child(QAccessibleTable *this,int logicalIndex)

{
  bool bVar1;
  int iVar2;
  QAbstractItemView *view_;
  QAbstractItemModel *pQVar3;
  uint *puVar4;
  QHeaderView *pQVar5;
  QHeaderView *pQVar6;
  int in_ESI;
  QAccessibleTable *in_RDI;
  long in_FS_OFFSET;
  QAccessibleInterface *iface;
  int column;
  int row;
  int columns;
  int hHeader;
  int vHeader;
  QAbstractItemModel *theModel;
  QAbstractItemView *theView;
  QModelIndex index;
  const_iterator id;
  QModelIndex rootIndex;
  QAbstractItemView *in_stack_fffffffffffffee8;
  QAccessibleTable *in_stack_fffffffffffffef0;
  ChildCache *this_00;
  QAbstractItemView *in_stack_fffffffffffffef8;
  QAccessibleTable *in_stack_ffffffffffffff00;
  QAccessibleTableCell *local_c8;
  uint local_bc;
  uint local_b8;
  QAccessibleTableCell *local_90;
  char local_80 [32];
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  piter local_48;
  piter local_38;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = in_ESI;
  view_ = view((QAccessibleTable *)0x7f603d);
  if (view_ == (QAbstractItemView *)0x0) {
    local_90 = (QAccessibleTableCell *)0x0;
  }
  else {
    pQVar3 = QAbstractItemView::model((QAbstractItemView *)in_stack_ffffffffffffff00);
    if (pQVar3 == (QAbstractItemModel *)0x0) {
      local_90 = (QAccessibleTableCell *)0x0;
    }
    else {
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      local_20 = &DAT_aaaaaaaaaaaaaaaa;
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      QAbstractItemView::rootIndex((QAbstractItemView *)in_stack_fffffffffffffef0);
      local_38.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
      local_38.d = (Data<QHashPrivate::Node<int,_unsigned_int>_> *)&DAT_aaaaaaaaaaaaaaaa;
      local_38 = (piter)QHash<int,_unsigned_int>::constFind
                                  ((QHash<int,_unsigned_int> *)in_stack_fffffffffffffef0,
                                   (int *)in_stack_fffffffffffffee8);
      local_48 = (piter)QHash<int,_unsigned_int>::constEnd
                                  ((QHash<int,_unsigned_int> *)in_stack_fffffffffffffef8);
      bVar1 = QHash<int,_unsigned_int>::const_iterator::operator!=
                        ((const_iterator *)in_stack_fffffffffffffef8,
                         (const_iterator *)in_stack_fffffffffffffef0);
      if (bVar1) {
        puVar4 = QHash<int,_unsigned_int>::const_iterator::value((const_iterator *)0x7f614c);
        local_90 = (QAccessibleTableCell *)QAccessible::accessibleInterface(*puVar4);
      }
      else {
        pQVar5 = verticalHeader(in_stack_fffffffffffffef0);
        pQVar6 = horizontalHeader(in_stack_ffffffffffffff00);
        iVar2 = (**(code **)(*(long *)pQVar3 + 0x80))(pQVar3,&local_28);
        iVar2 = iVar2 + (uint)(pQVar5 != (QHeaderView *)0x0);
        local_b8 = local_c / iVar2;
        local_bc = local_c % iVar2;
        local_c8 = (QAccessibleTableCell *)0x0;
        if ((pQVar5 != (QHeaderView *)0x0) != 0) {
          if (local_bc == 0) {
            if ((pQVar6 != (QHeaderView *)0x0) && (local_b8 == 0)) {
              local_c8 = (QAccessibleTableCell *)operator_new(0x18);
              QAccessibleTableCornerButton::QAccessibleTableCornerButton
                        ((QAccessibleTableCornerButton *)in_stack_fffffffffffffef0,
                         in_stack_fffffffffffffee8);
            }
            else {
              local_c8 = (QAccessibleTableCell *)operator_new(0x20);
              QAccessibleTableHeaderCell::QAccessibleTableHeaderCell
                        ((QAccessibleTableHeaderCell *)in_stack_ffffffffffffff00,
                         in_stack_fffffffffffffef8,(int)((ulong)in_stack_fffffffffffffef0 >> 0x20),
                         (Orientation)in_stack_fffffffffffffef0);
            }
          }
          local_bc = local_bc - 1;
        }
        if ((local_c8 == (QAccessibleTableCell *)0x0) && (pQVar6 != (QHeaderView *)0x0)) {
          if (local_b8 == 0) {
            local_c8 = (QAccessibleTableCell *)operator_new(0x20);
            QAccessibleTableHeaderCell::QAccessibleTableHeaderCell
                      ((QAccessibleTableHeaderCell *)in_stack_ffffffffffffff00,
                       in_stack_fffffffffffffef8,(int)((ulong)in_stack_fffffffffffffef0 >> 0x20),
                       (Orientation)in_stack_fffffffffffffef0);
          }
          local_b8 = local_b8 - 1;
        }
        if (local_c8 == (QAccessibleTableCell *)0x0) {
          local_60 = &DAT_aaaaaaaaaaaaaaaa;
          local_58 = &DAT_aaaaaaaaaaaaaaaa;
          local_50 = &DAT_aaaaaaaaaaaaaaaa;
          (**(code **)(*(long *)pQVar3 + 0x60))(&local_60,pQVar3,local_b8,local_bc,&local_28);
          bVar1 = QModelIndex::isValid((QModelIndex *)in_stack_fffffffffffffef0);
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            QMessageLogger::QMessageLogger
                      ((QMessageLogger *)in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8
                       ,(int)((ulong)in_stack_fffffffffffffef0 >> 0x20),
                       (char *)in_stack_fffffffffffffee8);
            QMessageLogger::warning
                      (local_80,"QAccessibleTable::child: Invalid index at: %d %d",(ulong)local_b8,
                       (ulong)local_bc);
            local_90 = (QAccessibleTableCell *)0x0;
            goto LAB_007f6413;
          }
          local_c8 = (QAccessibleTableCell *)operator_new(0x38);
          cellRole(in_RDI);
          QAccessibleTableCell::QAccessibleTableCell
                    (local_c8,view_,(QModelIndex *)in_stack_fffffffffffffef0,
                     (Role)((ulong)in_stack_fffffffffffffee8 >> 0x20));
        }
        QAccessible::registerAccessibleInterface((QAccessibleInterface *)local_c8);
        this_00 = &in_RDI->childToId;
        QAccessible::uniqueId((QAccessibleInterface *)local_c8);
        QHash<int,_unsigned_int>::insert(this_00,(int *)in_stack_fffffffffffffee8,(uint *)0x7f63fc);
        local_90 = local_c8;
      }
    }
  }
LAB_007f6413:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return &local_90->super_QAccessibleInterface;
  }
  __stack_chk_fail();
}

Assistant:

QAccessibleInterface *QAccessibleTable::child(int logicalIndex) const
{
    QAbstractItemView *theView = view();
    if (!theView)
        return nullptr;

    const QAbstractItemModel *theModel = theView->model();
    if (!theModel)
        return nullptr;

    const QModelIndex rootIndex = theView->rootIndex();
    auto id = childToId.constFind(logicalIndex);
    if (id != childToId.constEnd())
        return QAccessible::accessibleInterface(id.value());

    int vHeader = verticalHeader() ? 1 : 0;
    int hHeader = horizontalHeader() ? 1 : 0;

    int columns = theModel->columnCount(rootIndex) + vHeader;

    int row = logicalIndex / columns;
    int column = logicalIndex % columns;

    QAccessibleInterface *iface = nullptr;

    if (vHeader) {
        if (column == 0) {
            if (hHeader && row == 0) {
                iface = new QAccessibleTableCornerButton(theView);
            } else {
                iface = new QAccessibleTableHeaderCell(theView, row - hHeader, Qt::Vertical);
            }
        }
        --column;
    }
    if (!iface && hHeader) {
        if (row == 0) {
            iface = new QAccessibleTableHeaderCell(theView, column, Qt::Horizontal);
        }
        --row;
    }

    if (!iface) {
        QModelIndex index = theModel->index(row, column, rootIndex);
        if (Q_UNLIKELY(!index.isValid())) {
            qWarning("QAccessibleTable::child: Invalid index at: %d %d", row, column);
            return nullptr;
        }
        iface = new QAccessibleTableCell(theView, index, cellRole());
    }

    QAccessible::registerAccessibleInterface(iface);
    childToId.insert(logicalIndex, QAccessible::uniqueId(iface));
    return iface;
}